

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

bool soul::isFollowedByBlankLine(CodeLocation *pos)

{
  bool bVar1;
  CodeLocation local_a0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  CodeLocation::getSourceLine_abi_cxx11_(&local_50,pos);
  choc::text::trimEnd(&local_70,&local_50);
  if (local_70._M_string_length == 0) {
    bVar1 = true;
  }
  else {
    CodeLocation::getStartOfNextLine(&local_a0);
    CodeLocation::getSourceLine_abi_cxx11_(&local_90,&local_a0);
    choc::text::trimEnd(&local_30,&local_90);
    bVar1 = local_30._M_string_length == 0;
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_90);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_a0.sourceCode);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

static bool isFollowedByBlankLine (CodeLocation pos)
{
    return choc::text::trimEnd (pos.getSourceLine()).empty()
        || choc::text::trimEnd (pos.getStartOfNextLine().getSourceLine()).empty();
}